

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

vec2 vec2_rotate(vec2 v,float theta)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 local_38;
  undefined4 uStack_34;
  
  fVar2 = cosf(theta);
  uStack_34 = v.y;
  fVar3 = sinf(theta);
  local_38 = v.x;
  fVar4 = cosf(theta);
  fVar5 = sinf(theta);
  vVar1.y = fVar4 * uStack_34 + fVar5 * local_38;
  vVar1.x = fVar2 * local_38 - fVar3 * uStack_34;
  return vVar1;
}

Assistant:

vec2 vec2_rotate(vec2 v, float theta) {
    vec2 u;
    u.x = v.x * cosf(theta) - v.y * sinf(theta);
    u.y = v.y * cosf(theta) + v.x * sinf(theta);
    return u;
}